

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
agge::pod_vector<agge::tests::(anonymous_namespace)::A>::grow
          (pod_vector<agge::tests::(anonymous_namespace)::A> *this,count_t by)

{
  A *pAVar1;
  A *pAVar2;
  A *pAVar3;
  uint uVar4;
  ulong uVar5;
  A *pAVar6;
  long lVar7;
  uint uVar8;
  
  pAVar2 = this->_begin;
  pAVar3 = this->_end;
  uVar5 = (long)this->_limit - (long)pAVar2;
  uVar4 = (uint)(uVar5 >> 2);
  uVar8 = (uint)(uVar5 >> 3) & 0x7fffffff;
  if (uVar4 < by * 2) {
    uVar8 = by;
  }
  uVar5 = (ulong)(uVar8 + uVar4 + (uint)(uVar8 == 0));
  pAVar6 = (A *)operator_new__(uVar5 * 4);
  for (lVar7 = 0; pAVar1 = (A *)((long)&pAVar2->a + lVar7), pAVar1 != pAVar3; lVar7 = lVar7 + 4) {
    *(int *)((long)&pAVar6->a + lVar7) = pAVar1->a;
  }
  if (pAVar2 != (A *)0x0) {
    operator_delete__(pAVar2);
  }
  this->_begin = pAVar6;
  this->_end = (A *)((long)&pAVar6->a + ((long)pAVar3 - (long)pAVar2 & 0x3fffffffcU));
  this->_limit = pAVar6 + uVar5;
  return;
}

Assistant:

inline void pod_vector<T>::grow(count_t by)
	{
		count_t size = this->size(), new_capacity = capacity();

		new_capacity += agge_max(2 * by > new_capacity ? by : new_capacity / 2, 1u);

		T *buffer = new T[new_capacity], *p = buffer;
		
		for (iterator i = _begin; i != _end; )
			*p++ = *i++;
		delete []_begin;
		_begin = buffer;
		_end = _begin + size;
		_limit = _begin + new_capacity;
	}